

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int is_nifti_file(char *hname)

{
  int iVar1;
  char *fname;
  znzFile file;
  size_t sVar2;
  int iVar3;
  int local_184;
  znzFile fp;
  nifti_1_header nhdr;
  
  iVar1 = nifti_validfilename(hname);
  iVar3 = -1;
  if (iVar1 != 0) {
    fname = nifti_findhdrname(hname);
    if (fname == (char *)0x0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** no header file found for \'%s\'\n",hname);
      }
    }
    else {
      iVar1 = nifti_is_gzfile(fname);
      file = znzopen(fname,"rb",iVar1);
      fp = file;
      free(fname);
      if (file != (znzFile)0x0) {
        sVar2 = znzread(&nhdr,1,0x15c,file);
        Xznzclose(&fp);
        if (0x15b < (int)sVar2) {
          if ((((nhdr.magic[0] == 'n') && (nhdr.magic[3] == '\0')) &&
              (nhdr.magic[1] == 'i' || nhdr.magic[1] == '+')) &&
             (0xf6 < (byte)(nhdr.magic[2] - 0x3aU))) {
            iVar3 = (nhdr.magic[1] != '+') + 1;
          }
          else {
            local_184 = nhdr.sizeof_hdr;
            iVar3 = 0;
            if (nhdr.sizeof_hdr != 0x15c) {
              nifti_swap_4bytes(1,&local_184);
              iVar3 = -(uint)(local_184 != 0x15c);
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int is_nifti_file( const char *hname )
{
   struct nifti_1_header nhdr ;
   znzFile fp ;
   int ii ;
   char *tmpname;

   /* bad input name? */

   if( !nifti_validfilename(hname) ) return -1 ;

   /* open file */

   tmpname = nifti_findhdrname(hname);
   if( tmpname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no header file found for '%s'\n",hname);
      return -1;
   }
   fp = znzopen( tmpname , "rb" , nifti_is_gzfile(tmpname) ) ;
   free(tmpname);
   if (znz_isnull(fp))                      return -1 ;  /* bad open? */

   /* read header, close file */

   ii = (int)znzread( &nhdr , 1 , sizeof(nhdr) , fp ) ;
   znzclose( fp ) ;
   if( ii < (int) sizeof(nhdr) )               return -1 ;  /* bad read? */

   /* check for NIFTI-ness */

   if( NIFTI_VERSION(nhdr) != 0 ){
     return ( NIFTI_ONEFILE(nhdr) ) ? 1 : 2 ;
   }

   /* check for ANALYZE-ness (sizeof_hdr field == 348) */

   ii = nhdr.sizeof_hdr ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   /* try byte-swapping header */

   swap_4(ii) ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   return -1 ;                          /* not good */
}